

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall helics::apps::Connector::initialize(Connector *this)

{
  bool bVar1;
  element_type *peVar2;
  long in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *conn;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range4;
  ConnectionsList connectionsData;
  Modes cmode;
  undefined8 in_stack_fffffffffffff7f8;
  uint uVar4;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  ConnectionsList *pCVar3;
  ConnectionsList *in_stack_fffffffffffff800;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffff808;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
  *in_stack_fffffffffffff810;
  Federate *in_stack_fffffffffffff840;
  Federate *in_stack_fffffffffffff8e8;
  string_view in_stack_fffffffffffff8f0;
  string_view in_stack_fffffffffffff900;
  HelicsSequencingModes in_stack_fffffffffffff920;
  Connector *in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9b8;
  InterfaceDirection in_stack_fffffffffffff9bc;
  Connector *in_stack_fffffffffffff9c0;
  string_view in_stack_fffffffffffff9c8;
  string_view in_stack_fffffffffffff9d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9f0;
  ConnectionsList *in_stack_fffffffffffffa90;
  Connector *in_stack_fffffffffffffa98;
  ConnectionsList *in_stack_fffffffffffffb30;
  Connector *in_stack_fffffffffffffb38;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_428;
  __sv_type local_408;
  __sv_type local_3f8;
  reference local_3e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3e0;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_3d8;
  undefined1 *local_3d0;
  string *in_stack_fffffffffffffc38;
  undefined1 auStack_30 [24];
  byte local_18;
  Modes local_9;
  
  uVar4 = (uint)((ulong)in_stack_fffffffffffff7f8 >> 0x20);
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1f7245);
  local_9 = Federate::getCurrentMode((Federate *)0x1f7254);
  if (local_9 == STARTUP) {
    bVar1 = CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
            empty(in_stack_fffffffffffff810);
    if (!bVar1) {
      generateRegexMatchers(in_stack_fffffffffffff9a0);
    }
    this_00 = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 8);
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1f729b);
    Federate::enterInitializingModeIterative
              ((Federate *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1f72b7);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,(char *)in_stack_fffffffffffff808);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,(char *)in_stack_fffffffffffff808);
    this_01 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((ulong)uVar4 << 0x20);
    Federate::query_abi_cxx11_
              (in_stack_fffffffffffff8e8,in_stack_fffffffffffff900,in_stack_fffffffffffff8f0,
               in_stack_fffffffffffff920);
    generateConnectionsList(in_stack_fffffffffffffc38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff800);
    if ((local_18 & 1) != 0) {
      local_3d0 = auStack_30;
      local_3d8._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)CLI::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::begin(this_01);
      local_3e0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CLI::std::
                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::end(this_01);
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)in_stack_fffffffffffff800,
                           (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)this_01);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_3e8 = __gnu_cxx::
                    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ::operator*(&local_3d8);
        local_3f8 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff800);
        local_408 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff800);
        local_428.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_428.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_428.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_01 = &local_428;
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1f7439);
        in_stack_fffffffffffff808 = this_01;
        addConnection(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9d8,in_stack_fffffffffffff9c8,
                      in_stack_fffffffffffff9bc,in_stack_fffffffffffff9f0);
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator++(&local_3d8);
      }
      establishPotentialInterfaces(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
      CLI::std::
      __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f7500);
      Federate::enterInitializingModeIterative
                ((Federate *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      CLI::std::
      __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1f7522);
      Federate::enterInitializingModeIterative
                ((Federate *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      peVar2 = CLI::std::
               __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1f7544);
      in_stack_fffffffffffff800 =
           (ConnectionsList *)
           ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
           (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (this_00,(char *)in_stack_fffffffffffff808);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (this_00,(char *)in_stack_fffffffffffff808);
      pCVar3 = (ConnectionsList *)((ulong)this_01 & 0xffffffff00000000);
      Federate::query_abi_cxx11_
                (in_stack_fffffffffffff8e8,in_stack_fffffffffffff900,in_stack_fffffffffffff8f0,
                 in_stack_fffffffffffff920);
      generateConnectionsList(in_stack_fffffffffffffc38);
      ConnectionsList::operator=(in_stack_fffffffffffff800,pCVar3);
      ConnectionsList::~ConnectionsList(in_stack_fffffffffffff800);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff800);
    }
    makeConnections(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1f7634);
    Federate::enterInitializingMode(in_stack_fffffffffffff840);
    ConnectionsList::~ConnectionsList(in_stack_fffffffffffff800);
  }
  return;
}

Assistant:

void Connector::initialize()
{
    auto cmode = fed->getCurrentMode();
    if (cmode == Federate::Modes::STARTUP) {
        if (!matchers.empty()) {
            generateRegexMatchers();
        }
        fed->enterInitializingModeIterative();

        auto connectionsData =
            generateConnectionsList(fed->query("root", "unconnected_interfaces"));
        if (connectionsData.hasPotentialInterfaces) {
            for (const auto& conn : connectionsData.potentialInterfaceConnections) {
                addConnection(conn.first, conn.second);
            }
            establishPotentialInterfaces(connectionsData);
            fed->enterInitializingModeIterative();
            // need to do this twice to sync enverything
            fed->enterInitializingModeIterative();
            connectionsData = generateConnectionsList(fed->query("root", "unconnected_interfaces"));
        }
        makeConnections(connectionsData);
        fed->enterInitializingMode();
    }
}